

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# omptarget.cpp
# Opt level: O1

int target_data_update(DeviceTy *Device,int32_t arg_num,void **args_base,void **args,
                      int64_t *arg_sizes,int64_t *arg_types)

{
  undefined8 *HstPtrBegin;
  long Size;
  undefined8 *puVar1;
  int32_t iVar2;
  int iVar3;
  void *TgtPtrBegin;
  _Rb_tree_node_base *p_Var4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  bool IsLast;
  bool local_61;
  DeviceTy *local_60;
  pthread_mutex_t *local_58;
  _Rb_tree_node_base *local_50;
  int64_t *local_48;
  ulong local_40;
  void **local_38;
  
  if (arg_num < 1) {
    iVar3 = 0;
  }
  else {
    local_58 = (pthread_mutex_t *)&Device->ShadowMtx;
    local_50 = &(Device->ShadowPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    uVar6 = (ulong)(uint)arg_num;
    uVar7 = 0;
    local_60 = Device;
    local_48 = arg_sizes;
    local_40 = uVar6;
    local_38 = args;
    do {
      if ((*(ushort *)(arg_types + uVar7) & 0x180) == 0) {
        HstPtrBegin = (undefined8 *)local_38[uVar7];
        Size = arg_sizes[uVar7];
        TgtPtrBegin = DeviceTy::getTgtPtrBegin(Device,HstPtrBegin,Size,&local_61,false);
        if (TgtPtrBegin == (void *)0x0) {
          uVar5 = 4;
        }
        else {
          if ((*(byte *)(arg_types + uVar7) & 2) != 0) {
            iVar2 = DeviceTy::data_retrieve(local_60,HstPtrBegin,TgtPtrBegin,Size);
            uVar5 = 1;
            if (iVar2 != 0) goto LAB_0010756e;
            iVar3 = pthread_mutex_lock(local_58);
            if (iVar3 != 0) goto LAB_001075ab;
            p_Var4 = (local_60->ShadowPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            if (p_Var4 != local_50) {
              do {
                puVar1 = *(undefined8 **)(p_Var4 + 1);
                iVar3 = 7;
                if ((HstPtrBegin <= puVar1) &&
                   (iVar3 = 5, puVar1 < (undefined8 *)(Size + (long)HstPtrBegin))) {
                  *puVar1 = p_Var4[1]._M_parent;
                  iVar3 = 0;
                }
                if ((iVar3 != 7) && (iVar3 != 0)) break;
                p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
              } while (p_Var4 != local_50);
            }
            pthread_mutex_unlock(local_58);
            arg_sizes = local_48;
          }
          if ((*(byte *)(arg_types + uVar7) & 1) != 0) {
            iVar2 = DeviceTy::data_submit(local_60,TgtPtrBegin,HstPtrBegin,Size);
            uVar5 = 1;
            if (iVar2 == 0) {
              iVar3 = pthread_mutex_lock(local_58);
              if (iVar3 != 0) {
LAB_001075ab:
                std::__throw_system_error(iVar3);
              }
              p_Var4 = (local_60->ShadowPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
              ;
              if (p_Var4 != local_50) {
                do {
                  uVar5 = 10;
                  if ((HstPtrBegin <= *(undefined8 **)(p_Var4 + 1)) &&
                     (uVar5 = 8,
                     *(undefined8 **)(p_Var4 + 1) < (undefined8 *)(Size + (long)HstPtrBegin))) {
                    iVar2 = DeviceTy::data_submit(local_60,p_Var4[1]._M_left,&p_Var4[1]._M_right,8);
                    if (iVar2 == 0) {
                      uVar5 = 0;
                    }
                    else {
                      pthread_mutex_unlock(local_58);
                      uVar5 = 1;
                    }
                  }
                  if ((uVar5 != 10) && (uVar5 != 0)) goto LAB_00107550;
                  p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
                } while (p_Var4 != local_50);
              }
              uVar5 = 8;
LAB_00107550:
              if (uVar5 == 8) {
                pthread_mutex_unlock(local_58);
                uVar5 = 0;
              }
            }
            if (uVar5 != 0) goto LAB_0010756e;
          }
          uVar5 = 0;
        }
LAB_0010756e:
        uVar6 = local_40;
        Device = local_60;
        if ((uVar5 & 0xb) != 0) goto LAB_0010758e;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar6);
    uVar5 = 2;
LAB_0010758e:
    iVar3 = -(uint)(uVar5 != 2);
  }
  return iVar3;
}

Assistant:

int target_data_update(DeviceTy &Device, int32_t arg_num,
    void **args_base, void **args, int64_t *arg_sizes, int64_t *arg_types) {
  // process each input.
  for (int32_t i = 0; i < arg_num; ++i) {
    if ((arg_types[i] & OMP_TGT_MAPTYPE_LITERAL) ||
        (arg_types[i] & OMP_TGT_MAPTYPE_PRIVATE))
      continue;

    void *HstPtrBegin = args[i];
    int64_t MapSize = arg_sizes[i];
    bool IsLast;
    void *TgtPtrBegin = Device.getTgtPtrBegin(HstPtrBegin, MapSize, IsLast,
        false);
    if (!TgtPtrBegin) {
      DP("hst data:" DPxMOD " not found, becomes a noop\n", DPxPTR(HstPtrBegin));
      continue;
    }

    if (arg_types[i] & OMP_TGT_MAPTYPE_FROM) {
      DP("Moving %" PRId64 " bytes (tgt:" DPxMOD ") -> (hst:" DPxMOD ")\n",
          arg_sizes[i], DPxPTR(TgtPtrBegin), DPxPTR(HstPtrBegin));
      int rt = Device.data_retrieve(HstPtrBegin, TgtPtrBegin, MapSize);
      if (rt != OFFLOAD_SUCCESS) {
        DP("Copying data from device failed.\n");
        return OFFLOAD_FAIL;
      }

      uintptr_t lb = (uintptr_t) HstPtrBegin;
      uintptr_t ub = (uintptr_t) HstPtrBegin + MapSize;
      Device.ShadowMtx.lock();
      for (ShadowPtrListTy::iterator it = Device.ShadowPtrMap.begin();
          it != Device.ShadowPtrMap.end(); ++it) {
        void **ShadowHstPtrAddr = (void**) it->first;
        if ((uintptr_t) ShadowHstPtrAddr < lb)
          continue;
        if ((uintptr_t) ShadowHstPtrAddr >= ub)
          break;
        DP("Restoring original host pointer value " DPxMOD " for host pointer "
            DPxMOD "\n", DPxPTR(it->second.HstPtrVal),
            DPxPTR(ShadowHstPtrAddr));
        *ShadowHstPtrAddr = it->second.HstPtrVal;
      }
      Device.ShadowMtx.unlock();
    }

    if (arg_types[i] & OMP_TGT_MAPTYPE_TO) {
      DP("Moving %" PRId64 " bytes (hst:" DPxMOD ") -> (tgt:" DPxMOD ")\n",
          arg_sizes[i], DPxPTR(HstPtrBegin), DPxPTR(TgtPtrBegin));
      int rt = Device.data_submit(TgtPtrBegin, HstPtrBegin, MapSize);
      if (rt != OFFLOAD_SUCCESS) {
        DP("Copying data to device failed.\n");
        return OFFLOAD_FAIL;
      }
      uintptr_t lb = (uintptr_t) HstPtrBegin;
      uintptr_t ub = (uintptr_t) HstPtrBegin + MapSize;
      Device.ShadowMtx.lock();
      for (ShadowPtrListTy::iterator it = Device.ShadowPtrMap.begin();
          it != Device.ShadowPtrMap.end(); ++it) {
        void **ShadowHstPtrAddr = (void**) it->first;
        if ((uintptr_t) ShadowHstPtrAddr < lb)
          continue;
        if ((uintptr_t) ShadowHstPtrAddr >= ub)
          break;
        DP("Restoring original target pointer value " DPxMOD " for target "
            "pointer " DPxMOD "\n", DPxPTR(it->second.TgtPtrVal),
            DPxPTR(it->second.TgtPtrAddr));
        rt = Device.data_submit(it->second.TgtPtrAddr,
            &it->second.TgtPtrVal, sizeof(void *));
        if (rt != OFFLOAD_SUCCESS) {
          DP("Copying data to device failed.\n");
          Device.ShadowMtx.unlock();
          return OFFLOAD_FAIL;
        }
      }
      Device.ShadowMtx.unlock();
    }
  }
  return OFFLOAD_SUCCESS;
}